

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  bool bVar2;
  UInt UVar3;
  Value *pVVar4;
  CharReader *pCVar5;
  Value *this_00;
  OurFeatures local_30;
  
  this_00 = &this->settings_;
  pVVar4 = Value::operator[](this_00,"collectComments");
  bVar1 = Value::asBool(pVVar4);
  local_30.allowSpecialFloats_ = false;
  local_30.skipBom_ = false;
  local_30._10_6_ = 0;
  pVVar4 = Value::operator[](this_00,"allowComments");
  local_30.allowComments_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"allowTrailingCommas");
  local_30.allowTrailingCommas_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"strictRoot");
  local_30.strictRoot_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"allowDroppedNullPlaceholders");
  local_30.allowDroppedNullPlaceholders_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"allowNumericKeys");
  local_30.allowNumericKeys_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"allowSingleQuotes");
  local_30.allowSingleQuotes_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"stackLimit");
  UVar3 = Value::asUInt(pVVar4);
  local_30.stackLimit_ = (size_t)UVar3;
  pVVar4 = Value::operator[](this_00,"failIfExtra");
  local_30.failIfExtra_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"rejectDupKeys");
  local_30.rejectDupKeys_ = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_00,"allowSpecialFloats");
  bVar2 = Value::asBool(pVVar4);
  local_30.allowSpecialFloats_ = bVar2;
  pVVar4 = Value::operator[](this_00,"skipBom");
  bVar2 = Value::asBool(pVVar4);
  local_30.skipBom_ = bVar2;
  pCVar5 = (CharReader *)operator_new(0x140);
  pCVar5->_vptr_CharReader = (_func_int **)&PTR__OurCharReader_00b38918;
  *(bool *)&pCVar5[1]._vptr_CharReader = bVar1;
  OurReader::OurReader((OurReader *)(pCVar5 + 2),&local_30);
  return pCVar5;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const {
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.allowTrailingCommas_ = settings_["allowTrailingCommas"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ =
      settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();

  // Stack limit is always a size_t, so we get this as an unsigned int
  // regardless of it we have 64-bit integer support enabled.
  features.stackLimit_ = static_cast<size_t>(settings_["stackLimit"].asUInt());
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  features.skipBom_ = settings_["skipBom"].asBool();
  return new OurCharReader(collectComments, features);
}